

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvlTree.cpp
# Opt level: O3

Node * __thiscall AvlTree::containsElement(AvlTree *this,int value,Node *node)

{
  long lVar1;
  
  if (node != (Node *)0x0) {
    do {
      lVar1 = 8;
      if ((node->value <= value) && (lVar1 = 0x10, value <= node->value)) {
        return node;
      }
      node = *(Node **)((long)&node->value + lVar1);
    } while (node != (Node *)0x0);
  }
  return (Node *)0x0;
}

Assistant:

AvlTree::Node *AvlTree::containsElement(int value, Node *node) {
    if (node == nullptr) { // Element not found
        return nullptr;
    } else if (value < node->value) { // Searching for element
        return containsElement(value, node->leftChild);
    } else if (value > node->value) {
        return containsElement(value, node->rightChild);
    } else { // Element found
        return node;
    }
}